

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::ingest_stream::print(ingest_stream *this)

{
  bool bVar1;
  pointer this_00;
  __normal_iterator<const_fmp4_stream::media_fragment_*,_std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>_>
  local_20;
  __normal_iterator<const_fmp4_stream::media_fragment_*,_std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>_>
  local_18;
  const_iterator it;
  ingest_stream *this_local;
  
  it._M_current = (media_fragment *)this;
  local_18._M_current =
       (media_fragment *)
       std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::begin
                 (&this->media_fragment_);
  while( true ) {
    local_20._M_current =
         (media_fragment *)
         std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::end
                   (&this->media_fragment_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_fmp4_stream::media_fragment_*,_std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>_>
              ::operator->(&local_18);
    media_fragment::print(this_00);
    __gnu_cxx::
    __normal_iterator<const_fmp4_stream::media_fragment_*,_std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>_>
    ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void ingest_stream::print() const
	{
		for (auto it = media_fragment_.begin(); it != media_fragment_.end(); it++)
		{
			it->print();
		}
	}